

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraSim.c
# Opt level: O3

void Fra_SmlInitialize(Fra_Sml_t *p,int fInit)

{
  int iVar1;
  int iVar2;
  Aig_Man_t *pAVar3;
  Vec_Ptr_t *pVVar4;
  uint uVar5;
  ulong uVar6;
  long lVar7;
  ulong uVar8;
  
  pAVar3 = p->pAig;
  if (fInit == 0) {
    pVVar4 = pAVar3->vCis;
    if (0 < pVVar4->nSize) {
      lVar7 = 0;
      do {
        Fra_SmlAssignRandom(p,(Aig_Obj_t *)pVVar4->pArray[lVar7]);
        lVar7 = lVar7 + 1;
        pVVar4 = p->pAig->vCis;
      } while (lVar7 < pVVar4->nSize);
    }
  }
  else {
    iVar1 = pAVar3->nRegs;
    if (iVar1 < 1) {
      __assert_fail("Aig_ManRegNum(p->pAig) > 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/fra/fraSim.c"
                    ,0x196,"void Fra_SmlInitialize(Fra_Sml_t *, int)");
    }
    iVar2 = pAVar3->nObjs[2];
    uVar5 = iVar2 - iVar1;
    uVar6 = (ulong)uVar5;
    if (uVar5 == 0 || iVar2 < iVar1) {
      __assert_fail("Aig_ManRegNum(p->pAig) < Aig_ManCiNum(p->pAig)",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/fra/fraSim.c"
                    ,0x197,"void Fra_SmlInitialize(Fra_Sml_t *, int)");
    }
    if (uVar5 != 0 && iVar1 <= iVar2) {
      lVar7 = 0;
      do {
        if (pAVar3->vCis->nSize <= lVar7) goto LAB_0060cc10;
        Fra_SmlAssignRandom(p,(Aig_Obj_t *)pAVar3->vCis->pArray[lVar7]);
        lVar7 = lVar7 + 1;
        pAVar3 = p->pAig;
        uVar6 = (long)pAVar3->nObjs[2] - (long)pAVar3->nRegs;
      } while (lVar7 < (long)uVar6);
    }
    pVVar4 = pAVar3->vCis;
    if ((int)uVar6 < pVVar4->nSize) {
      uVar8 = uVar6 & 0xffffffff;
      do {
        if ((int)uVar6 < 0) {
LAB_0060cc10:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecPtr.h"
                        ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
        }
        Fra_SmlAssignConst(p,(Aig_Obj_t *)pVVar4->pArray[uVar8],0,0);
        uVar8 = uVar8 + 1;
        pVVar4 = p->pAig->vCis;
      } while ((int)uVar8 < pVVar4->nSize);
    }
  }
  return;
}

Assistant:

void Fra_SmlInitialize( Fra_Sml_t * p, int fInit )
{
    Aig_Obj_t * pObj;
    int i;
    if ( fInit )
    {
        assert( Aig_ManRegNum(p->pAig) > 0 );
        assert( Aig_ManRegNum(p->pAig) < Aig_ManCiNum(p->pAig) );
        // assign random info for primary inputs
        Aig_ManForEachPiSeq( p->pAig, pObj, i )
            Fra_SmlAssignRandom( p, pObj );
        // assign the initial state for the latches
        Aig_ManForEachLoSeq( p->pAig, pObj, i )
            Fra_SmlAssignConst( p, pObj, 0, 0 );
    }
    else
    {
        Aig_ManForEachCi( p->pAig, pObj, i )
            Fra_SmlAssignRandom( p, pObj );
    }
}